

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,_2,_0>::calcPartialsPartials
          (BeagleCPU4StateSSEImpl<double,_2,_0> *this,double *destP,double *partials_q,
          double *matrices_q,double *partials_r,double *matrices_r,int startPattern,int endPattern)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int l;
  int iVar15;
  VecUnion vu_mq [6] [2];
  double local_1b8 [49];
  
  iVar14 = 0;
  iVar13 = ((this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
            kPatternCount - endPattern) +
           (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
           kExtraPatterns;
  for (iVar15 = 0;
      iVar15 < (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
               kCategoryCount; iVar15 = iVar15 + 1) {
    for (lVar11 = 0; lVar11 != 0x30; lVar11 = lVar11 + 8) {
      *(undefined8 *)((long)local_1b8 + lVar11 * 4 + 0xc0) =
           *(undefined8 *)((long)matrices_q + lVar11);
      *(undefined8 *)((long)local_1b8 + lVar11 * 4 + 200) =
           *(undefined8 *)((long)matrices_q + lVar11 + 0x30);
      *(undefined8 *)((long)local_1b8 + lVar11 * 4) = *(undefined8 *)((long)matrices_r + lVar11);
      *(undefined8 *)((long)local_1b8 + lVar11 * 4 + 8) =
           *(undefined8 *)((long)matrices_r + lVar11 + 0x30);
      *(undefined8 *)((long)local_1b8 + lVar11 * 4 + 0xd0) =
           *(undefined8 *)((long)matrices_q + lVar11 + 0x60);
      *(undefined8 *)((long)local_1b8 + lVar11 * 4 + 0xd8) =
           *(undefined8 *)((long)matrices_q + lVar11 + 0x90);
      *(undefined8 *)((long)local_1b8 + lVar11 * 4 + 0x10) =
           *(undefined8 *)((long)matrices_r + lVar11 + 0x60);
      *(undefined8 *)((long)local_1b8 + lVar11 * 4 + 0x18) =
           *(undefined8 *)((long)matrices_r + lVar11 + 0x90);
    }
    iVar14 = iVar14 + startPattern * 4;
    lVar11 = 0;
    lVar12 = (long)iVar14;
    for (iVar10 = startPattern; iVar10 < endPattern; iVar10 = iVar10 + 1) {
      iVar14 = iVar14 + 4;
      dVar2 = *(double *)((long)partials_q + lVar11 + lVar12 * 8);
      dVar3 = *(double *)((long)partials_q + lVar11 + lVar12 * 8 + 8);
      dVar4 = *(double *)((long)partials_q + lVar11 + lVar12 * 8 + 0x10);
      dVar5 = *(double *)((long)partials_q + lVar11 + lVar12 * 8 + 0x18);
      dVar6 = *(double *)((long)partials_r + lVar11 + lVar12 * 8);
      dVar7 = *(double *)((long)partials_r + lVar11 + lVar12 * 8 + 8);
      dVar8 = *(double *)((long)partials_r + lVar11 + lVar12 * 8 + 0x10);
      dVar9 = *(double *)((long)partials_r + lVar11 + lVar12 * 8 + 0x18);
      pdVar1 = (double *)((long)destP + lVar11 + (long)(startPattern * 2) * 0x10);
      *pdVar1 = (dVar5 * local_1b8[0x24] +
                dVar4 * local_1b8[0x20] + dVar2 * local_1b8[0x18] + dVar3 * local_1b8[0x1c]) *
                (dVar9 * local_1b8[0xc] +
                dVar8 * local_1b8[8] + dVar6 * local_1b8[0] + dVar7 * local_1b8[4]);
      pdVar1[1] = (dVar5 * local_1b8[0x25] +
                  dVar4 * local_1b8[0x21] + dVar2 * local_1b8[0x19] + dVar3 * local_1b8[0x1d]) *
                  (dVar9 * local_1b8[0xd] +
                  dVar8 * local_1b8[9] + dVar6 * local_1b8[1] + dVar7 * local_1b8[5]);
      pdVar1 = (double *)((long)destP + lVar11 + (long)(startPattern * 2) * 0x10 + 0x10);
      *pdVar1 = (dVar5 * local_1b8[0x26] +
                dVar4 * local_1b8[0x22] + dVar2 * local_1b8[0x1a] + dVar3 * local_1b8[0x1e]) *
                (dVar9 * local_1b8[0xe] +
                dVar8 * local_1b8[10] + dVar6 * local_1b8[2] + dVar7 * local_1b8[6]);
      pdVar1[1] = (dVar5 * local_1b8[0x27] +
                  dVar4 * local_1b8[0x23] + dVar2 * local_1b8[0x1b] + dVar3 * local_1b8[0x1f]) *
                  (dVar9 * local_1b8[0xf] +
                  dVar8 * local_1b8[0xb] + dVar6 * local_1b8[3] + dVar7 * local_1b8[7]);
      lVar11 = lVar11 + 0x20;
    }
    iVar10 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
             kExtraPatterns;
    if (iVar10 == 0) {
      lVar11 = lVar11 + (long)(startPattern * 2) * 0x10;
    }
    else {
      iVar14 = iVar14 + iVar10 * 4;
      lVar11 = (long)(iVar10 * 2) * 0x10 + lVar11 + (long)(startPattern * 2) * 0x10;
    }
    iVar14 = iVar14 + iVar13 * 4;
    destP = (double *)((long)destP + (long)(iVar13 * 2) * 0x10 + lVar11);
    matrices_r = matrices_r + 0x18;
    matrices_q = matrices_q + 0x18;
  }
  return;
}

Assistant:

BEAGLE_CPU_4_SSE_TEMPLATE
void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::calcPartialsPartials(double* destP,
                                                                           const double*  partials_q,
                                                                           const double*  matrices_q,
                                                                           const double*  partials_r,
                                                                           const double*  matrices_r,
                                                                           int startPattern,
                                                                           int endPattern) {

    int patternDefficit = kPatternCount + kExtraPatterns - endPattern;

    int v = 0;
    int w = 0;

    V_Real	destq_01, destq_23, destr_01, destr_23;
 	  VecUnion vu_mq[OFFSET][2], vu_mr[OFFSET][2];
	  V_Real *destPvec = (V_Real *)destP;

    for (int l = 0; l < kCategoryCount; l++) {
      destPvec += startPattern*2;
      v += startPattern*4;
		/* Load transition-probability matrices into vectors */
    	SSE_PREFETCH_MATRICES(matrices_q + w, matrices_r + w, vu_mq, vu_mr);

        for (int k = startPattern; k < endPattern; k++) {

#           if 1 && !defined(_WIN32)
            __builtin_prefetch (&partials_q[v+64]);
            __builtin_prefetch (&partials_r[v+64]);
//            __builtin_prefetch (destPvec+32,1,0);
#           endif

        	V_Real vpq_0, vpq_1, vpq_2, vpq_3;
        	SSE_PREFETCH_PARTIALS(vpq_,partials_q,v);

        	V_Real vpr_0, vpr_1, vpr_2, vpr_3;
        	SSE_PREFETCH_PARTIALS(vpr_,partials_r,v);

#			if 1	/* This would probably be faster on PPC/Altivec, which has a fused multiply-add
			           vector instruction */

			destq_01 = VEC_MULT(vpq_0, vu_mq[0][0].vx);
			destq_01 = VEC_MADD(vpq_1, vu_mq[1][0].vx, destq_01);
			destq_01 = VEC_MADD(vpq_2, vu_mq[2][0].vx, destq_01);
			destq_01 = VEC_MADD(vpq_3, vu_mq[3][0].vx, destq_01);
			destq_23 = VEC_MULT(vpq_0, vu_mq[0][1].vx);
			destq_23 = VEC_MADD(vpq_1, vu_mq[1][1].vx, destq_23);
			destq_23 = VEC_MADD(vpq_2, vu_mq[2][1].vx, destq_23);
			destq_23 = VEC_MADD(vpq_3, vu_mq[3][1].vx, destq_23);

			destr_01 = VEC_MULT(vpr_0, vu_mr[0][0].vx);
			destr_01 = VEC_MADD(vpr_1, vu_mr[1][0].vx, destr_01);
			destr_01 = VEC_MADD(vpr_2, vu_mr[2][0].vx, destr_01);
			destr_01 = VEC_MADD(vpr_3, vu_mr[3][0].vx, destr_01);
			destr_23 = VEC_MULT(vpr_0, vu_mr[0][1].vx);
			destr_23 = VEC_MADD(vpr_1, vu_mr[1][1].vx, destr_23);
			destr_23 = VEC_MADD(vpr_2, vu_mr[2][1].vx, destr_23);
			destr_23 = VEC_MADD(vpr_3, vu_mr[3][1].vx, destr_23);

#			else	/* SSE doesn't have a fused multiply-add, so a slight speed gain should be
                       achieved by decoupling these operations to avoid dependency stalls */

			V_Real a, b, c, d;

			a = VEC_MULT(vpq_0, vu_mq[0][0].vx);
			b = VEC_MULT(vpq_2, vu_mq[2][0].vx);
			c = VEC_MULT(vpq_0, vu_mq[0][1].vx);
			d = VEC_MULT(vpq_2, vu_mq[2][1].vx);
			a = VEC_MADD(vpq_1, vu_mq[1][0].vx, a);
			b = VEC_MADD(vpq_3, vu_mq[3][0].vx, b);
			c = VEC_MADD(vpq_1, vu_mq[1][1].vx, c);
			d = VEC_MADD(vpq_3, vu_mq[3][1].vx, d);
			destq_01 = VEC_ADD(a, b);
			destq_23 = VEC_ADD(c, d);

			a = VEC_MULT(vpr_0, vu_mr[0][0].vx);
			b = VEC_MULT(vpr_2, vu_mr[2][0].vx);
			c = VEC_MULT(vpr_0, vu_mr[0][1].vx);
			d = VEC_MULT(vpr_2, vu_mr[2][1].vx);
			a = VEC_MADD(vpr_1, vu_mr[1][0].vx, a);
			b = VEC_MADD(vpr_3, vu_mr[3][0].vx, b);
			c = VEC_MADD(vpr_1, vu_mr[1][1].vx, c);
			d = VEC_MADD(vpr_3, vu_mr[3][1].vx, d);
			destr_01 = VEC_ADD(a, b);
			destr_23 = VEC_ADD(c, d);

#			endif

#			if 1//
            destPvec[0] = VEC_MULT(destq_01, destr_01);
            destPvec[1] = VEC_MULT(destq_23, destr_23);
            destPvec += 2;

#			else	/* VEC_STORE did demonstrate a measurable performance gain as
					   it copies all (2/4) values to memory simultaneously;
					   I can no longer reproduce the performance gain (?) */

			VEC_STORE(destP + v + 0,VEC_MULT(destq_01, destr_01));
			VEC_STORE(destP + v + 2,VEC_MULT(destq_23, destr_23));

#			endif

            v += 4;
        }
        w += OFFSET*4;
        if (kExtraPatterns) {
        	destPvec += kExtraPatterns * 2;
        	v += kExtraPatterns * 4;
        }
        destPvec += patternDefficit * 2;
        v += patternDefficit * 4;
    }
}